

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.h
# Opt level: O2

void * ibuf_alloc(ibuf *ibuf,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = ibuf->wpos;
  pcVar2 = pcVar1;
  if (ibuf->end < pcVar1 + size) {
    pcVar1 = (char *)ibuf_reserve_slow(ibuf,size);
    if (pcVar1 == (char *)0x0) {
      return (void *)0x0;
    }
    pcVar2 = ibuf->wpos;
  }
  ibuf->wpos = pcVar2 + size;
  return pcVar1;
}

Assistant:

static inline void *
ibuf_alloc(struct ibuf *ibuf, size_t size)
{
	void *ptr;
	if (ibuf->wpos + size <= ibuf->end) {
		/*
		 * In case of using same buffer we need to unpoison newly
		 * allocated memory after previous ibuf_alloc or poison after
		 * newly allocated memory after previous ibuf_reserve.
		 */
		ibuf_unpoison_unallocated(ibuf);
		ptr = ibuf->wpos;
	} else {
		ptr = ibuf_reserve_slow(ibuf, size);
		if (ptr == NULL)
			return NULL;
	}
	ibuf->wpos += size;
	ibuf_poison_unallocated(ibuf);
	return ptr;
}